

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O0

void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256 *hash,uchar *key,size_t keylen)

{
  ulong in_RDX;
  void *in_RSI;
  secp256k1_sha256 *in_RDI;
  secp256k1_sha256 sha256;
  uchar rkey [64];
  size_t n;
  size_t in_stack_ffffffffffffff30;
  uchar *in_stack_ffffffffffffff38;
  secp256k1_sha256 *in_stack_ffffffffffffff40;
  byte local_68 [72];
  ulong local_20;
  ulong local_18;
  secp256k1_sha256 *local_8;
  
  local_8 = in_RDI;
  if (in_RDX < 0x41) {
    local_18 = in_RDX;
    memcpy(local_68,in_RSI,in_RDX);
    memset(local_68 + local_18,0,0x40 - local_18);
  }
  else {
    secp256k1_sha256_initialize((secp256k1_sha256 *)&stack0xffffffffffffff30);
    secp256k1_sha256_write
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    secp256k1_sha256_finalize(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    memset(local_68 + 0x20,0,0x20);
  }
  secp256k1_sha256_initialize(local_8 + 1);
  for (local_20 = 0; local_20 < 0x40; local_20 = local_20 + 1) {
    local_68[local_20] = local_68[local_20] ^ 0x5c;
  }
  secp256k1_sha256_write
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  secp256k1_sha256_initialize(local_8);
  for (local_20 = 0; local_20 < 0x40; local_20 = local_20 + 1) {
    local_68[local_20] = local_68[local_20] ^ 0x6a;
  }
  secp256k1_sha256_write
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  memset(local_68,0,0x40);
  return;
}

Assistant:

static void secp256k1_hmac_sha256_initialize(secp256k1_hmac_sha256 *hash, const unsigned char *key, size_t keylen) {
    size_t n;
    unsigned char rkey[64];
    if (keylen <= sizeof(rkey)) {
        memcpy(rkey, key, keylen);
        memset(rkey + keylen, 0, sizeof(rkey) - keylen);
    } else {
        secp256k1_sha256 sha256;
        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, key, keylen);
        secp256k1_sha256_finalize(&sha256, rkey);
        memset(rkey + 32, 0, 32);
    }

    secp256k1_sha256_initialize(&hash->outer);
    for (n = 0; n < sizeof(rkey); n++) {
        rkey[n] ^= 0x5c;
    }
    secp256k1_sha256_write(&hash->outer, rkey, sizeof(rkey));

    secp256k1_sha256_initialize(&hash->inner);
    for (n = 0; n < sizeof(rkey); n++) {
        rkey[n] ^= 0x5c ^ 0x36;
    }
    secp256k1_sha256_write(&hash->inner, rkey, sizeof(rkey));
    memset(rkey, 0, sizeof(rkey));
}